

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O3

void libcmepoll_LTX_add_select
               (CMtrans_services_conflict svc,select_data_ptr *sdp,int fd,select_list_func func,
               void *arg1,void *arg2)

{
  undefined8 *puVar1;
  select_data_ptr psVar2;
  FunctionListElement *pFVar3;
  long lVar4;
  int iVar5;
  FunctionListElement *pFVar6;
  int *piVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  uint32_t local_3c;
  int local_38;
  undefined4 local_34;
  
  psVar2 = *sdp;
  if (psVar2->cm != (CManager)0x0) {
    iVar5 = (*svc->return_CM_lock_status)
                      (psVar2->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                       ,0x1d8);
    if (iVar5 == 0) goto LAB_001015b8;
  }
  psVar2->select_consistency_number = psVar2->select_consistency_number + 1;
  lVar10 = (long)fd;
  if (psVar2->sel_item_max < fd) {
    sVar9 = (size_t)(fd * 0x18 + 0x18);
    pFVar6 = (FunctionListElement *)(*svc->realloc_func)(psVar2->write_items,sVar9);
    psVar2->write_items = pFVar6;
    pFVar6 = (FunctionListElement *)(*svc->realloc_func)(psVar2->select_items,sVar9);
    psVar2->select_items = pFVar6;
    if ((pFVar6 == (FunctionListElement *)0x0) ||
       (pFVar3 = psVar2->write_items, pFVar3 == (FunctionListElement *)0x0)) {
      libcmepoll_LTX_add_select_cold_2();
LAB_001015b8:
      printf("%s:%u: failed assertion `%s\'\n",
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
             ,0x1d8,"CM_LOCKED(svc, sd->cm)");
      abort();
    }
    iVar5 = psVar2->sel_item_max;
    if (iVar5 < fd) {
      lVar8 = lVar10 - iVar5;
      lVar4 = (long)iVar5 * 0x18;
      do {
        puVar1 = (undefined8 *)((long)&pFVar3[1].func + lVar4);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&pFVar3[1].arg2 + lVar4) = 0;
        *(undefined8 *)((long)&pFVar6[1].arg2 + lVar4) = 0;
        puVar1 = (undefined8 *)((long)&pFVar6[1].func + lVar4);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar8 = lVar8 + -1;
        lVar4 = lVar4 + 0x18;
      } while (lVar8 != 0);
    }
    psVar2->sel_item_max = fd;
  }
  local_34 = 0;
  local_3c = 1;
  local_38 = fd;
  iVar5 = epoll_ctl(psVar2->epfd,1,fd,(epoll_event *)&local_3c);
  if (iVar5 < 0) {
    piVar7 = __errno_location();
    if (*piVar7 == 0x11) {
      local_3c = 5;
      iVar5 = epoll_ctl(psVar2->epfd,3,fd,(epoll_event *)&local_3c);
      if (iVar5 < 0) {
        libcmepoll_LTX_add_select_cold_1();
      }
    }
    else {
      fprintf(_stderr,"Something bad in %s. %d\n","libcmepoll_LTX_add_select");
    }
  }
  (*svc->verbose)(psVar2->cm,CMSelectVerbose,"Adding fd %d to select read list",(ulong)(uint)fd);
  pFVar6 = psVar2->select_items;
  pFVar6[lVar10].func = func;
  pFVar6[lVar10].arg1 = arg1;
  pFVar6[lVar10].arg2 = arg2;
  wake_server_thread((select_data_ptr)(ulong)(uint)psVar2->wake_write_fd);
  return;
}

Assistant:

extern void
libcmepoll_LTX_add_select(CMtrans_services svc, select_data_ptr *sdp, int fd, select_list_func func, void *arg1, void *arg2)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);
    struct epoll_event ep_event;

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }
    sd->select_consistency_number++;
    if (fd > sd->sel_item_max) {
	int i;
	int size = (fd+1)*sizeof(sd->select_items[0]);
	sd->write_items = 
	    (FunctionListElement *) svc->realloc_func(sd->write_items, size);
	sd->select_items = 
	    (FunctionListElement *) svc->realloc_func(sd->select_items, size);
	if ((sd->select_items == NULL) || (sd->write_items == NULL)) {
	    perror("Realloc failed\n");
	    exit(1);
	}

	for (i = sd->sel_item_max + 1; i <= fd; i++) {
	    sd->write_items[i].func = NULL;
	    sd->write_items[i].arg1 = NULL;
	    sd->write_items[i].arg2 = NULL;
	    sd->select_items[i].func = NULL;
	    sd->select_items[i].arg1 = NULL;
	    sd->select_items[i].arg2 = NULL;
	}
	sd->sel_item_max = fd;
    }
    memset(&ep_event, 0, sizeof(ep_event));
    ep_event.events = EPOLLIN;
    ep_event.data.fd = fd;
    if(epoll_ctl(sd->epfd, EPOLL_CTL_ADD, fd, &ep_event) < 0) {
    	if(errno == EEXIST) {
    		/* This is fd is already armed for read */
    		ep_event.events = EPOLLIN | EPOLLOUT;
    		if (epoll_ctl(sd->epfd, EPOLL_CTL_MOD, fd, &ep_event) < 0) {
    			fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    		}
    	} else {
    		fprintf(stderr, "Something bad in %s. %d\n", __func__, errno);
    	}
    }

    svc->verbose(sd->cm, CMSelectVerbose, "Adding fd %d to select read list", fd);
    sd->select_items[fd].func = func;
    sd->select_items[fd].arg1 = arg1;
    sd->select_items[fd].arg2 = arg2;
    wake_server_thread(sd);
}